

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraymatcher.cpp
# Opt level: O3

qsizetype __thiscall
QStaticByteArrayMatcherBase::indexOfIn
          (QStaticByteArrayMatcherBase *this,char *needle,size_t nlen,char *haystack,qsizetype hlen,
          qsizetype from)

{
  bool bVar1;
  qsizetype qVar2;
  size_t sVar3;
  byte *pbVar4;
  long lVar5;
  long lVar6;
  byte *pbVar7;
  
  lVar5 = 0;
  if (0 < from) {
    lVar5 = from;
  }
  if (nlen == 0) {
    qVar2 = -1;
    if (lVar5 <= hlen) {
      qVar2 = lVar5;
    }
    return qVar2;
  }
  lVar6 = -nlen;
  pbVar4 = (byte *)(haystack + nlen + lVar5 + -1);
  do {
    if (haystack + hlen <= pbVar4) {
      return -1;
    }
    sVar3 = (size_t)(this->m_skiptable).data[*pbVar4];
    if (sVar3 == 0) {
      sVar3 = nlen;
      pbVar7 = pbVar4;
      if ((long)nlen < 1) {
        lVar6 = 0;
LAB_0030627b:
        return (qsizetype)(pbVar4 + (lVar6 - (long)haystack) + 1);
      }
      while (*pbVar7 == needle[sVar3 - 1]) {
        sVar3 = sVar3 - 1;
        pbVar7 = pbVar7 + -1;
        if (sVar3 == 0) goto LAB_0030627b;
      }
      if ((this->m_skiptable).data[*pbVar7] != nlen) {
        sVar3 = 1;
      }
    }
    bVar1 = haystack + hlen + -sVar3 < pbVar4;
    pbVar4 = pbVar4 + sVar3;
    if (bVar1) {
      return -1;
    }
  } while( true );
}

Assistant:

qsizetype QStaticByteArrayMatcherBase::indexOfIn(const char *needle, size_t nlen, const char *haystack, qsizetype hlen, qsizetype from) const noexcept
{
    if (from < 0)
        from = 0;
    return bm_find(reinterpret_cast<const uchar *>(haystack), hlen, from,
                   reinterpret_cast<const uchar *>(needle),   nlen, m_skiptable.data);
}